

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

string * __thiscall
libserver::server::_get_username_abi_cxx11_(string *__return_storage_ptr__,server *this)

{
  server *this_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->client_name);
  return __return_storage_ptr__;
}

Assistant:

const std::string libserver::server::_get_username()
{
    return client_name;
}